

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O3

int mpt_connection_dispatch(mpt_connection *con,mpt_event_handler_t cmd,void *arg)

{
  byte bVar1;
  byte bVar2;
  mpt_buffer *pmVar3;
  mpt_stream *srm;
  int iVar4;
  ulong uVar5;
  long lVar6;
  mpt_metatype *pmVar7;
  mpt_buffer *pmVar8;
  ulong len;
  ulong len_00;
  uint64_t id;
  mpt_msgtype hdr;
  mpt_event ev;
  _streamWrapper sw;
  mpt_message msg;
  long local_b8;
  mpt_buffer *local_b0;
  undefined1 local_a2;
  undefined1 local_a1;
  ulong local_a0;
  mpt_event local_98;
  mpt_message local_78;
  mpt_message local_58;
  
  local_98.reply = (mpt_reply_context *)0x0;
  local_98.msg = (mpt_message *)0x0;
  local_98.id = 0;
  local_58.cont = (iovec *)0x0;
  local_58.clen = 0;
  local_58.used = 0;
  local_58.base = (void *)0x0;
  bVar1 = (con->out).state;
  if ((bVar1 & 0x10) != 0) {
    return 0x10000;
  }
  if ((con->out).sock._id < 0) {
    srm = (mpt_stream *)(con->out).buf._buf;
    if (srm != (mpt_stream *)0x0) {
      iVar4 = mpt_stream_dispatch(srm,streamWrapper,&local_78);
      return iVar4;
    }
    return -1;
  }
  if ((bVar1 & 0x20) == 0) {
    return 0x10000;
  }
  (con->out).state = bVar1 & 0xcf;
  pmVar3 = (con->out).buf._buf;
  if (pmVar3 == (mpt_buffer *)0x0) {
    if (cmd == (mpt_event_handler_t)0x0) {
      return 0;
    }
LAB_00104d51:
    iVar4 = (*cmd)(arg,&local_98);
  }
  else {
    bVar1 = (con->out)._idlen;
    bVar2 = (con->out)._smax;
    len_00 = (ulong)bVar2;
    len = (ulong)((uint)bVar2 + (uint)bVar1);
    uVar5 = pmVar3->_used;
    local_78.used = uVar5 - len;
    if (uVar5 < len) {
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%u < %u)","datagram too small",len,
              uVar5 & 0xffffffff);
      mpt_outdata_reply(&con->out,len_00,pmVar3 + 1,(mpt_message *)0x0);
    }
    else {
      if (cmd == (mpt_event_handler_t)0x0) {
        pmVar3->_used = 0;
        mpt_outdata_reply(&con->out,len,pmVar3 + 1,(mpt_message *)0x0);
        return 0;
      }
      pmVar8 = pmVar3 + 1;
      if (bVar1 == 0) {
        local_98.msg = &local_78;
        local_78.cont = (iovec *)0x0;
        local_78.clen = 0;
        local_78.base = (void *)((long)&pmVar8->_vptr + len);
        goto LAB_00104d51;
      }
      if (-1 < (char)*(byte *)&pmVar8->_vptr) {
        uVar5 = 0;
        do {
          if (*(char *)((long)&pmVar8->_vptr + uVar5) != '\0') {
            pmVar7 = con->_rctx;
            local_b0 = pmVar8;
            if (pmVar7 == (mpt_metatype *)0x0) {
              local_a0 = len;
              pmVar7 = (mpt_metatype *)mpt_reply_deferrable(len,replyConnection,con);
              if (pmVar7 == (mpt_metatype *)0x0) {
                mpt_log(0,"mpt::connection::dispatch<mpt::output>",4,"%s: %s","dispatch incomplete",
                        "no context available");
                pmVar8 = local_b0;
                len = local_a0;
                break;
              }
              con->_rctx = pmVar7;
              len = local_a0;
            }
            local_78.used = 0;
            local_b8 = 0;
            iVar4 = (*(pmVar7->_vptr->convertable).convert)((mpt_convertable *)pmVar7,8,&local_b8);
            if ((iVar4 < 0) || (local_b8 == 0)) {
              local_98.reply = (mpt_reply_context *)0x0;
              pmVar8 = local_b0;
            }
            else {
              (*(pmVar7->_vptr->convertable).convert)((mpt_convertable *)pmVar7,0x82,&local_78);
              local_98.reply = (mpt_reply_context *)local_78.used;
              pmVar8 = local_b0;
              if (((mpt_reply_context *)local_78.used != (mpt_reply_context *)0x0) &&
                 (iVar4 = mpt_reply_set(local_b8,(ulong)bVar1,local_b0), pmVar8 = local_b0,
                 iVar4 < 0)) {
                mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s","dispatch failed",
                        "context not ready");
                return -4;
              }
            }
            goto LAB_00104f34;
          }
          uVar5 = uVar5 + 1;
        } while (bVar1 != uVar5);
        local_78.used = 0;
        local_b8 = 0;
        local_98.reply = (mpt_reply_context *)0x0;
LAB_00104f34:
        local_58.base = (void *)((long)&pmVar8->_vptr + len);
        local_98.msg = &local_58;
        local_58.used = pmVar3->_used - len;
        iVar4 = (*cmd)(arg,&local_98);
        if ((mpt_reply_context *)local_78.used == (mpt_reply_context *)0x0) {
          return iVar4;
        }
        if (*(short *)(local_b8 + 2) == 0) {
          return iVar4;
        }
        local_58.base = &local_a2;
        local_a2 = 1;
        local_a1 = (undefined1)iVar4;
        local_58.used = 2;
        local_58.cont = (iovec *)0x0;
        (*(*(_mpt_vptr_reply_context **)local_78.used)->reply)
                  ((mpt_reply_context *)local_78.used,&local_58);
        return iVar4;
      }
      local_78.cont = (iovec *)0x0;
      local_78.clen = 0;
      *(byte *)&pmVar8->_vptr = *(byte *)&pmVar8->_vptr & 0x7f;
      iVar4 = mpt_message_buf2id((long)&pmVar8->_vptr + len_00,bVar1,&local_b8);
      if (-1 < iVar4) {
        lVar6 = mpt_command_get(&con->_wait,local_b8);
        if (lVar6 == 0) {
          mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s (lx)",
                  "reply processing failed","message not registered",local_b8);
        }
        else {
          local_78.base = (void *)((long)&pmVar8->_vptr + len);
          local_78.used = pmVar3->_used - len;
          iVar4 = (**(code **)(lVar6 + 8))(*(undefined8 *)(lVar6 + 0x10));
          if (-1 < iVar4) {
            return 0;
          }
          mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","reply processing failed",
                  iVar4);
        }
        return -0x11;
      }
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","bad message length",bVar1);
      pmVar3->_used = len_00;
    }
    iVar4 = -2;
  }
  return iVar4;
}

Assistant:

extern int mpt_connection_dispatch(MPT_STRUCT(connection) *con, MPT_TYPE(event_handler) cmd, void *arg)
{
	static const char _func[] = "mpt::connection::dispatch<mpt::output>";
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
	uint8_t *data;
	uint16_t hlen;
	uint8_t ilen, slen;
	
	/* message transfer in progress */
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_EVENTFLAG(Retry);
	}
	if (!MPT_socket_active(&con->out.sock)) {
		struct _streamWrapper sw;
		
		if (!(buf = con->out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_dispatch((void *) buf, streamWrapper, &sw);
	}
	/* no new data present */
	if (!(con->out.state & MPT_OUTFLAG(Received))) {
		return MPT_EVENTFLAG(Retry);
	}
	con->out.state &= ~MPT_OUTFLAG(Received);
	
	/* no message data */
	if (!(buf = con->out.buf._buf)) {
		return cmd ? cmd(arg, &ev) : 0;
	}
	ilen = con->out._idlen;
	slen = con->out._smax;
	hlen = ilen + slen;
	
	if ((size_t) hlen > buf->_used) {
		mpt_log(0, _func, MPT_LOG(Error), "%s (%u < %u)", MPT_tr("datagram too small"), hlen, (int) buf->_used);
		mpt_outdata_reply(&con->out, slen, buf + 1, 0);
		return MPT_ERROR(BadValue);
	}
	/* discard existing message */
	if (!cmd) {
		buf->_used = 0;
		mpt_outdata_reply(&con->out, hlen, buf + 1, 0);
		return 0;
	}
	data = (void *) (buf + 1);
	/* no message id */
	if (!ilen) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		return cmd(arg, &ev);
	}
	/* got reply message */
	if (data[0] & 0x80) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		MPT_STRUCT(command) *ans;
		uint64_t id;
		int len;
		data[0] &= 0x7f;
		if ((len = mpt_message_buf2id(data + slen, ilen, &id)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message length"), (int) ilen);
			buf->_used = slen;
			return MPT_ERROR(BadValue);
		}
		if (!(ans = mpt_command_get(&con->_wait, id))) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s (" PRIx64 ")",
			        MPT_tr("reply processing failed"), MPT_tr("message not registered"), id);
			return MPT_ERROR(MissingBuffer);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		if ((len = ans->cmd(ans->arg, &msg)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("reply processing failed"), len);
			return MPT_ERROR(MissingBuffer);
		}
		return 0;
	}
	else {
		MPT_INTERFACE(metatype) *ctx = 0;
		MPT_INTERFACE(reply_context) *rc;
		MPT_STRUCT(reply_data) *rd;
		int ret;
		uint8_t i;
		
		/* need processing */
		for (i = 0; i < ilen; ++i) {
			if (!data[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if (!(ctx = mpt_reply_deferrable(hlen, replyConnection, con))) {
				mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
				        MPT_tr("dispatch incomplete"), MPT_tr("no context available"));
				break;
			}
			con->_rctx = ctx;
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, ilen, data) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		
		ret = cmd(arg, &ev);
		
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			msg.base = &hdr;
			msg.used = sizeof(hdr);
			msg.cont = 0;
			rc->_vptr->reply(rc, &msg);
		}
		return ret;
	}
}